

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcombobox.cpp
# Opt level: O0

void QComboBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QComboBox *this;
  bool bVar1;
  QObject QVar2;
  InsertPolicy IVar3;
  SizeAdjustPolicy SVar4;
  int iVar5;
  LabelDrawingMode LVar6;
  QSize QVar7;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QComboBox *_t;
  QVariant _r;
  QString *in_stack_fffffffffffffec8;
  QComboBox *in_stack_fffffffffffffed0;
  QSize *in_stack_fffffffffffffed8;
  QComboBox *in_stack_fffffffffffffee0;
  QSize *in_stack_fffffffffffffee8;
  code *in_stack_fffffffffffffef0;
  QComboBox *in_stack_fffffffffffffef8;
  QComboBox *in_stack_ffffffffffffff00;
  QComboBox *in_stack_ffffffffffffff10;
  QVariant local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_fffffffffffffed8 = (QSize *)(ulong)in_EDX;
    iVar5 = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
    switch(in_stack_fffffffffffffed8) {
    case (QSize *)0x0:
      editTextChanged(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      break;
    case (QSize *)0x1:
      activated((QComboBox *)0x53de9d,iVar5);
      break;
    case (QSize *)0x2:
      textActivated(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      break;
    case (QSize *)0x3:
      highlighted((QComboBox *)0x53dedb,iVar5);
      break;
    case (QSize *)0x4:
      textHighlighted(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      break;
    case (QSize *)0x5:
      currentIndexChanged((QComboBox *)0x53df19,iVar5);
      break;
    case (QSize *)0x6:
      currentTextChanged(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      break;
    case (QSize *)0x7:
      clear(in_stack_ffffffffffffff10);
      break;
    case (QSize *)0x8:
      clearEditText((QComboBox *)in_stack_fffffffffffffef0);
      break;
    case (QSize *)0x9:
      setEditText((QComboBox *)in_stack_fffffffffffffee8,(QString *)in_stack_fffffffffffffee0);
      break;
    case (QSize *)0xa:
      setCurrentIndex((QComboBox *)in_stack_fffffffffffffee8,
                      (int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
      break;
    case (QSize *)0xb:
      setCurrentText(in_stack_fffffffffffffee0,(QString *)in_stack_fffffffffffffed8);
      break;
    case (QSize *)0xc:
      local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      inputMethodQuery(in_stack_ffffffffffffff00,
                       (InputMethodQuery)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                       (QVariant *)in_stack_fffffffffffffef0);
      if (*(long *)in_RCX != 0) {
        ::QVariant::operator=
                  ((QVariant *)in_stack_fffffffffffffed8,(QVariant *)in_stack_fffffffffffffed0);
      }
      ::QVariant::~QVariant((QVariant *)&local_28);
    }
  }
  if (in_ESI == 5) {
    bVar1 = QtMocHelpers::indexOfMethod<void(QComboBox::*)(QString_const&)>
                      (in_RCX,(void **)editTextChanged,0,0);
    if ((((bVar1) ||
         (bVar1 = QtMocHelpers::indexOfMethod<void(QComboBox::*)(int)>
                            (in_RCX,(void **)activated,0,1), bVar1)) ||
        (bVar1 = QtMocHelpers::indexOfMethod<void(QComboBox::*)(QString_const&)>
                           (in_RCX,(void **)textActivated,0,2), bVar1)) ||
       (((bVar1 = QtMocHelpers::indexOfMethod<void(QComboBox::*)(int)>
                            (in_RCX,(void **)highlighted,0,3), bVar1 ||
         (bVar1 = QtMocHelpers::indexOfMethod<void(QComboBox::*)(QString_const&)>
                            (in_RCX,(void **)textHighlighted,0,4), bVar1)) ||
        (bVar1 = QtMocHelpers::indexOfMethod<void(QComboBox::*)(int)>
                           (in_RCX,(void **)currentIndexChanged,0,5), bVar1)))) goto LAB_0053e62a;
    in_stack_fffffffffffffef0 = currentTextChanged;
    in_stack_fffffffffffffef8 = (QComboBox *)0x0;
    bVar1 = QtMocHelpers::indexOfMethod<void(QComboBox::*)(QString_const&)>
                      (in_RCX,(void **)currentTextChanged,0,6);
    if (bVar1) goto LAB_0053e62a;
  }
  if (in_ESI == 1) {
    in_stack_fffffffffffffee8 = *(QSize **)in_RCX;
    in_stack_fffffffffffffed0 = (QComboBox *)(ulong)in_EDX;
    switch(in_stack_fffffffffffffed0) {
    case (QComboBox *)0x0:
      QVar2 = (QObject)isEditable(in_stack_fffffffffffffed0);
      ((QWidget *)&in_stack_fffffffffffffee8->wd)->super_QObject = QVar2;
      break;
    case (QComboBox *)0x1:
      iVar5 = count(in_stack_fffffffffffffee0);
      *(int *)&in_stack_fffffffffffffee8->wd = iVar5;
      break;
    case (QComboBox *)0x2:
      currentText((QComboBox *)in_stack_fffffffffffffee8);
      QString::operator=((QString *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      QString::~QString((QString *)0x53e2da);
      break;
    case (QComboBox *)0x3:
      iVar5 = currentIndex(in_stack_fffffffffffffed0);
      *(int *)&in_stack_fffffffffffffee8->wd = iVar5;
      break;
    case (QComboBox *)0x4:
      currentData((QComboBox *)in_stack_fffffffffffffee8,
                  (int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
      ::QVariant::operator=
                ((QVariant *)in_stack_fffffffffffffed8,(QVariant *)in_stack_fffffffffffffed0);
      ::QVariant::~QVariant(&local_48);
      break;
    case (QComboBox *)0x5:
      iVar5 = maxVisibleItems(in_stack_fffffffffffffed0);
      *(int *)&in_stack_fffffffffffffee8->wd = iVar5;
      break;
    case (QComboBox *)0x6:
      iVar5 = maxCount(in_stack_fffffffffffffed0);
      *(int *)&in_stack_fffffffffffffee8->wd = iVar5;
      break;
    case (QComboBox *)0x7:
      IVar3 = insertPolicy(in_stack_fffffffffffffed0);
      *(InsertPolicy *)&in_stack_fffffffffffffee8->wd = IVar3;
      break;
    case (QComboBox *)0x8:
      SVar4 = sizeAdjustPolicy(in_stack_fffffffffffffed0);
      *(SizeAdjustPolicy *)&in_stack_fffffffffffffee8->wd = SVar4;
      break;
    case (QComboBox *)0x9:
      iVar5 = minimumContentsLength(in_stack_fffffffffffffed0);
      *(int *)&in_stack_fffffffffffffee8->wd = iVar5;
      break;
    case (QComboBox *)0xa:
      QVar7 = iconSize(in_stack_fffffffffffffee0);
      *in_stack_fffffffffffffee8 = QVar7;
      break;
    case (QComboBox *)0xb:
      placeholderText((QComboBox *)in_stack_fffffffffffffed8);
      QString::operator=((QString *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      QString::~QString((QString *)0x53e41d);
      break;
    case (QComboBox *)0xc:
      QVar2 = (QObject)duplicatesEnabled(in_stack_fffffffffffffed0);
      ((QWidget *)&in_stack_fffffffffffffee8->wd)->super_QObject = QVar2;
      break;
    case (QComboBox *)0xd:
      QVar2 = (QObject)hasFrame(in_stack_fffffffffffffed0);
      ((QWidget *)&in_stack_fffffffffffffee8->wd)->super_QObject = QVar2;
      break;
    case (QComboBox *)0xe:
      iVar5 = modelColumn(in_stack_fffffffffffffed0);
      *(int *)&in_stack_fffffffffffffee8->wd = iVar5;
      break;
    case (QComboBox *)0xf:
      LVar6 = labelDrawingMode(in_stack_fffffffffffffed0);
      *(LabelDrawingMode *)&in_stack_fffffffffffffee8->wd = LVar6;
    }
  }
  if (in_ESI == 2) {
    this = *(QComboBox **)in_RCX;
    LVar6 = (LabelDrawingMode)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    switch(in_EDX) {
    case 0:
      setEditable(in_stack_fffffffffffffef8,SUB81((ulong)in_stack_fffffffffffffef0 >> 0x38,0));
      break;
    default:
      break;
    case 2:
      setCurrentText(this,(QString *)in_stack_fffffffffffffed8);
      break;
    case 3:
      setCurrentIndex((QComboBox *)in_stack_fffffffffffffee8,(int)((ulong)this >> 0x20));
      break;
    case 5:
      setMaxVisibleItems((QComboBox *)in_stack_fffffffffffffed8,
                         (int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
      break;
    case 6:
      setMaxCount((QComboBox *)in_stack_fffffffffffffef0,
                  (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      break;
    case 7:
      setInsertPolicy(in_stack_fffffffffffffed0,NoInsert);
      break;
    case 8:
      setSizeAdjustPolicy(this,LVar6);
      break;
    case 9:
      setMinimumContentsLength(this,LVar6);
      break;
    case 10:
      setIconSize(this,in_stack_fffffffffffffed8);
      break;
    case 0xb:
      setPlaceholderText(this,(QString *)in_stack_fffffffffffffed8);
      break;
    case 0xc:
      setDuplicatesEnabled(in_stack_fffffffffffffed0,false);
      break;
    case 0xd:
      setFrame(this,SUB81((ulong)in_stack_fffffffffffffed8 >> 0x38,0));
      break;
    case 0xe:
      setModelColumn(this,LVar6);
      break;
    case 0xf:
      setLabelDrawingMode(this,LVar6);
    }
  }
LAB_0053e62a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QComboBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->editTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->activated((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->textActivated((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 3: _t->highlighted((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->textHighlighted((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 5: _t->currentIndexChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->currentTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 7: _t->clear(); break;
        case 8: _t->clearEditText(); break;
        case 9: _t->setEditText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 10: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 11: _t->setCurrentText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 12: { QVariant _r = _t->inputMethodQuery((*reinterpret_cast< std::add_pointer_t<Qt::InputMethodQuery>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(const QString & )>(_a, &QComboBox::editTextChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(int )>(_a, &QComboBox::activated, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(const QString & )>(_a, &QComboBox::textActivated, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(int )>(_a, &QComboBox::highlighted, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(const QString & )>(_a, &QComboBox::textHighlighted, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(int )>(_a, &QComboBox::currentIndexChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBox::*)(const QString & )>(_a, &QComboBox::currentTextChanged, 6))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isEditable(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->count(); break;
        case 2: *reinterpret_cast<QString*>(_v) = _t->currentText(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->currentIndex(); break;
        case 4: *reinterpret_cast<QVariant*>(_v) = _t->currentData(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->maxVisibleItems(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->maxCount(); break;
        case 7: *reinterpret_cast<InsertPolicy*>(_v) = _t->insertPolicy(); break;
        case 8: *reinterpret_cast<SizeAdjustPolicy*>(_v) = _t->sizeAdjustPolicy(); break;
        case 9: *reinterpret_cast<int*>(_v) = _t->minimumContentsLength(); break;
        case 10: *reinterpret_cast<QSize*>(_v) = _t->iconSize(); break;
        case 11: *reinterpret_cast<QString*>(_v) = _t->placeholderText(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->duplicatesEnabled(); break;
        case 13: *reinterpret_cast<bool*>(_v) = _t->hasFrame(); break;
        case 14: *reinterpret_cast<int*>(_v) = _t->modelColumn(); break;
        case 15: *reinterpret_cast<LabelDrawingMode*>(_v) = _t->labelDrawingMode(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setEditable(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setCurrentText(*reinterpret_cast<QString*>(_v)); break;
        case 3: _t->setCurrentIndex(*reinterpret_cast<int*>(_v)); break;
        case 5: _t->setMaxVisibleItems(*reinterpret_cast<int*>(_v)); break;
        case 6: _t->setMaxCount(*reinterpret_cast<int*>(_v)); break;
        case 7: _t->setInsertPolicy(*reinterpret_cast<InsertPolicy*>(_v)); break;
        case 8: _t->setSizeAdjustPolicy(*reinterpret_cast<SizeAdjustPolicy*>(_v)); break;
        case 9: _t->setMinimumContentsLength(*reinterpret_cast<int*>(_v)); break;
        case 10: _t->setIconSize(*reinterpret_cast<QSize*>(_v)); break;
        case 11: _t->setPlaceholderText(*reinterpret_cast<QString*>(_v)); break;
        case 12: _t->setDuplicatesEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 13: _t->setFrame(*reinterpret_cast<bool*>(_v)); break;
        case 14: _t->setModelColumn(*reinterpret_cast<int*>(_v)); break;
        case 15: _t->setLabelDrawingMode(*reinterpret_cast<LabelDrawingMode*>(_v)); break;
        default: break;
        }
    }
}